

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::create_macro_symtab_lookup_table(CVmImageLoader *this)

{
  CVmObjPageEntry *pCVar1;
  CVmObjPageEntry *pCVar2;
  char *__s;
  anon_union_8_8_cb74652f_for_val aVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  vm_datatype_t *pvVar5;
  vm_val_t *pvVar6;
  vm_val_t *pvVar7;
  vm_obj_id_t vVar8;
  uint uVar9;
  size_t bytelen;
  vm_runtime_sym *pvVar10;
  vm_datatype_t vVar11;
  CVmObjPageEntry *this_00;
  size_t idx;
  vm_val_t v;
  vm_val_t lst;
  vm_val_t str;
  vm_val_t args;
  
  if (this->runtime_macros_ != (CVmRuntimeSymbols *)0x0) {
    if (this->reflection_macros_ == 0) {
      vVar8 = CVmObjLookupTable::create(0,0x100,(uint)this->runtime_macros_->cnt_);
      this->reflection_macros_ = vVar8;
      pvVar6 = sp_;
      pCVar1 = G_obj_table_X.pages_[vVar8 >> 0xc];
      pvVar5 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar5 = VM_OBJ;
      (pvVar6->val).obj = vVar8;
      pvVar10 = (vm_runtime_sym *)this->runtime_macros_;
      while (pvVar10 = pvVar10->nxt, pvVar10 != (vm_runtime_sym *)0x0) {
        str.val.obj = CVmObjString::create(0,pvVar10->sym,pvVar10->len);
        pvVar6 = sp_;
        vVar11 = VM_OBJ;
        aVar4._4_4_ = str.val._4_4_;
        aVar4.obj = str.val.obj;
        pvVar7 = sp_ + 1;
        *(ulong *)sp_ = CONCAT44(str._4_4_,5);
        sp_ = pvVar7;
        pvVar6->val = aVar4;
        str.typ = vVar11;
        lst.val.obj = CVmObjList::create(0,3);
        pvVar6 = sp_;
        aVar3._4_4_ = lst.val._4_4_;
        aVar3.obj = lst.val.obj;
        pvVar7 = sp_ + 1;
        *(ulong *)sp_ = CONCAT44(lst._4_4_,5);
        sp_ = pvVar7;
        pvVar6->val = aVar3;
        this_00 = G_obj_table_X.pages_[lst.val.obj >> 0xc] + (lst.val.obj & 0xfff);
        lst.typ = vVar11;
        CVmObjList::cons_clear((CVmObjList *)this_00);
        v.val.obj = CVmObjString::create(0,pvVar10->macro_expansion,pvVar10->macro_exp_len);
        v.typ = vVar11;
        CVmObjList::cons_set_element((CVmObjList *)this_00,0,&v);
        args.val.obj = CVmObjList::create(0,(long)pvVar10->macro_argc);
        uVar9 = args.val.obj & 0xfff;
        pCVar2 = G_obj_table_X.pages_[args.val.obj >> 0xc];
        args.typ = vVar11;
        CVmObjList::cons_clear((CVmObjList *)(pCVar2 + uVar9));
        CVmObjList::cons_set_element((CVmObjList *)this_00,1,&args);
        for (idx = 0; (long)idx < (long)pvVar10->macro_argc; idx = idx + 1) {
          __s = pvVar10->macro_args[idx];
          bytelen = strlen(__s);
          v.val.obj = CVmObjString::create(0,__s,bytelen);
          v.typ = VM_OBJ;
          CVmObjList::cons_set_element((CVmObjList *)(pCVar2 + uVar9),idx,&v);
        }
        v.val.obj = pvVar10->macro_flags;
        v.typ = VM_INT;
        CVmObjList::cons_set_element((CVmObjList *)this_00,2,&v);
        CVmObjLookupTable::add_entry((CVmObjLookupTable *)(pCVar1 + (vVar8 & 0xfff)),&str,&lst);
        sp_ = sp_ + -2;
      }
      sp_ = sp_ + -1;
    }
  }
  return;
}

Assistant:

void CVmImageLoader::create_macro_symtab_lookup_table(VMG0_)
{
    CVmObjLookupTable *lookup;
    vm_runtime_sym *sym;

    /* 
     *   if we don't have a runtime macro table, we can't create the
     *   reflection LookupTable 
     */
    if (runtime_macros_ == 0)
        return;

    /* if we already created the table, there's no need to create another */
    if (reflection_macros_ != VM_INVALID_OBJ)
        return;

    /* create a LookupTable to hold the symbols */
    reflection_macros_ = CVmObjLookupTable::
        create(vmg_ FALSE, 256, runtime_macros_->get_sym_count());

    /* get the object, properly cast */
    lookup = (CVmObjLookupTable *)vm_objp(vmg_ reflection_macros_);

    /* push the lookup table onto the stack for gc protection */
    G_stk->push()->set_obj(reflection_macros_);

    /* run through the symbols and populate the LookupTable */
    for (sym = runtime_macros_->get_head() ; sym != 0 ; sym = sym->nxt)
    {
        vm_val_t str;
        vm_val_t lst;
        vm_val_t args;
        vm_val_t v;
        int i;

        /* create a string object to hold this symbol */
        str.set_obj(CVmObjString::create(vmg_ FALSE, sym->sym, sym->len));

        /* stack it for gc protection */
        G_stk->push(&str);

        /* 
         *   Create a list to hold the definition.  We represent this as
         *   [expansion_string, [argument_list], flags]. 
         */
        lst.set_obj(CVmObjList::create(vmg_ FALSE, 3));
        G_stk->push(&lst);
        CVmObjList *lstp = (CVmObjList *)vm_objp(vmg_ lst.val.obj);
        lstp->cons_clear();

        /* create and store the expansion string */
        v.set_obj(CVmObjString::create(
            vmg_ FALSE, sym->macro_expansion, sym->macro_exp_len));
        lstp->cons_set_element(0, &v);

        /* create the argument list */
        args.set_obj(CVmObjList::create(vmg_ FALSE, sym->macro_argc));
        CVmObjList *argp = (CVmObjList *)vm_objp(vmg_ args.val.obj);
        argp->cons_clear();

        /* store the argument list in the definition list */
        lstp->cons_set_element(1, &args);

        /* store the arguments */
        for (i = 0 ; i < sym->macro_argc ; ++i)
        {
            /* create the string */
            char *p = sym->macro_args[i];
            size_t len = strlen(p);
            v.set_obj(CVmObjString::create(vmg_ FALSE, p, len));

            /* store it in the argument list */
            argp->cons_set_element(i, &v);
        }

        /* store the flags */
        v.set_int(sym->macro_flags);
        lstp->cons_set_element(2, &v);

        /* 
         *   add the macro to the lookup table - the symbol string is the
         *   key, and the symbol's value is the definition list
         */
        lookup->add_entry(vmg_ &str, &lst);

        /* done with the symbol and list gc protection */
        G_stk->discard(2);
    }

    /* done working - discard our gc protection */
    G_stk->discard();
}